

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::declare_undefined_values(CompilerMSL *this)

{
  uint id;
  SPIRUndef *pSVar1;
  SPIRType *pSVar2;
  undefined8 uVar3;
  long lVar4;
  allocator local_d9;
  ulong local_d8;
  LoopLock local_d0;
  ParsedIR *local_c8;
  TypedID<(spirv_cross::Types)0> *local_c0;
  long local_b8;
  string local_b0 [32];
  string local_90;
  string local_70;
  string local_50;
  
  local_c8 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_c8);
  local_c0 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_b8 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size << 2;
  local_d8 = 0;
  for (lVar4 = 0; local_b8 != lVar4; lVar4 = lVar4 + 4) {
    id = *(uint *)((long)&local_c0->id + lVar4);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeUndef) {
      pSVar1 = ParsedIR::get<spirv_cross::SPIRUndef>(local_c8,id);
      pSVar2 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(pSVar1->super_IVariant).field_0xc);
      if (*(int *)&(pSVar2->super_IVariant).field_0xc != 1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_b0,this,(ulong)(pSVar1->super_IVariant).self.id,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                  (&local_90,this,pSVar2,local_b0,(ulong)(pSVar1->super_IVariant).self.id);
        ::std::__cxx11::string::string((string *)&local_70,"constant",&local_d9);
        inject_top_level_storage_qualifier(&local_50,&local_90,&local_70);
        CompilerGLSL::statement<std::__cxx11::string,char_const(&)[7]>
                  (&this->super_CompilerGLSL,&local_50,(char (*) [7])" = {};");
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_90);
        uVar3 = ::std::__cxx11::string::~string(local_b0);
        local_d8 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_d0);
  if ((local_d8 & 1) != 0) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x375a3a);
  }
  return;
}

Assistant:

void CompilerMSL::declare_undefined_values()
{
	bool emitted = false;
	ir.for_each_typed_id<SPIRUndef>([&](uint32_t, SPIRUndef &undef) {
		auto &type = this->get<SPIRType>(undef.basetype);
		// OpUndef can be void for some reason ...
		if (type.basetype == SPIRType::Void)
			return;

		statement(inject_top_level_storage_qualifier(
				variable_decl(type, to_name(undef.self), undef.self),
				"constant"),
		          " = {};");
		emitted = true;
	});

	if (emitted)
		statement("");
}